

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_compare.cpp
# Opt level: O3

bool __thiscall
ON_wString::Equal(ON_wString *this,wchar_t *other_string,ON_Locale *locale,bool bIgnoreCase)

{
  bool bVar1;
  int element_count1;
  wchar_t *string1;
  
  string1 = operator_cast_to_wchar_t_(this);
  element_count1 = Length(this);
  ON_Locale::IsOrdinal(locale);
  bVar1 = EqualOrdinal(string1,element_count1,other_string,-1,bIgnoreCase);
  return bVar1;
}

Assistant:

bool ON_wString::Equal(
  const wchar_t* other_string,
  const class ON_Locale& locale,
  bool bIgnoreCase
  ) const
{
  return ON_wString::Equal(
    static_cast< const wchar_t* >(*this),
    this->Length(),
    other_string,
    -1,
    locale,
    bIgnoreCase
    );
}